

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::AsyncPipe::tryPumpFrom
          (AsyncPipe *this,AsyncInputStream *input,uint64_t amount)

{
  _func_int **pp_Var1;
  _func_int **in_RAX;
  void *pvVar2;
  long in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar3;
  Maybe<kj::Promise<unsigned_long>_> MVar4;
  AsyncOutputStream local_38;
  
  if (in_RCX == 0) {
    local_38._vptr_AsyncOutputStream = in_RAX;
    constPromise<unsigned_long,_0UL>();
    *(undefined1 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = 1;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = local_38._vptr_AsyncOutputStream;
  }
  else {
    pp_Var1 = input[4]._vptr_AsyncInputStream;
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(pp_Var1[1] + 0x10))(this,pp_Var1 + 1,amount);
      aVar3 = extraout_RDX;
      goto LAB_003c8799;
    }
    pvVar2 = operator_new(0x400);
    *(undefined8 *)((long)pvVar2 + 0x1f8) = 0;
    *(undefined ***)((long)pvVar2 + 0x1e8) = &PTR_destroy_00675848;
    *(undefined ***)((long)pvVar2 + 0x200) = &PTR_reject_00675898;
    *(undefined1 *)((long)pvVar2 + 0x208) = 0;
    *(undefined1 *)((long)pvVar2 + 0x3a0) = 0;
    *(undefined1 *)((long)pvVar2 + 0x3b0) = 1;
    *(undefined ***)((long)pvVar2 + 0x3b8) = &PTR_read_006758f8;
    *(undefined ***)((long)pvVar2 + 0x3c0) = &PTR_write_006759b8;
    *(long *)((long)pvVar2 + 0x3c8) = (long)pvVar2 + 0x200;
    *(AsyncInputStream **)((long)pvVar2 + 0x3d0) = input;
    *(uint64_t *)((long)pvVar2 + 0x3d8) = amount;
    *(long *)((long)pvVar2 + 0x3e0) = in_RCX;
    *(undefined8 *)((long)pvVar2 + 0x3f8) = 0;
    *(undefined8 *)((long)pvVar2 + 1000) = 0;
    *(undefined8 *)((long)pvVar2 + 0x3f0) = 0;
    input[4]._vptr_AsyncInputStream = (_func_int **)((long)pvVar2 + 0x3b8);
    *(void **)((long)pvVar2 + 0x1f0) = pvVar2;
    local_38._vptr_AsyncOutputStream = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_38);
    *(undefined1 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = 1;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = (_func_int **)((long)pvVar2 + 0x1e8);
  }
  local_38._vptr_AsyncOutputStream = (_func_int **)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_38);
  aVar3 = extraout_RDX_00;
LAB_003c8799:
  MVar4.ptr.field_1 = aVar3;
  MVar4.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar4.ptr;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(
      AsyncInputStream& input, uint64_t amount) override {
    if (amount == 0) {
      return constPromise<uint64_t, 0>();
    } else KJ_IF_SOME(s, state) {
      return s.tryPumpFrom(input, amount);
    } else {
      return newAdaptedPromise<uint64_t, BlockedPumpFrom>(*this, input, amount);
    }
  }